

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableEnumFieldGenerator::GenerateParsingCode
          (ImmutableEnumFieldGenerator *this,Printer *printer)

{
  char *text;
  
  text = 
  "int rawValue = input.readEnum();\n  @SuppressWarnings(\"deprecation\")\n$type$ value = $type$.$for_number$(rawValue);\nif (value == null) {\n  unknownFields.mergeVarintField($number$, rawValue);\n} else {\n  $set_has_field_bit_message$\n  $name$_ = rawValue;\n}\n"
  ;
  if (*(int *)(*(long *)(this->descriptor_ + 0x28) + 0x3c) == 3) {
    text = "int rawValue = input.readEnum();\n$set_has_field_bit_message$\n$name$_ = rawValue;\n";
  }
  io::Printer::Print(printer,&this->variables_,text);
  return;
}

Assistant:

void ImmutableEnumFieldGenerator::GenerateParsingCode(
    io::Printer* printer) const {
  if (SupportUnknownEnumValue(descriptor_->file())) {
    printer->Print(variables_,
                   "int rawValue = input.readEnum();\n"
                   "$set_has_field_bit_message$\n"
                   "$name$_ = rawValue;\n");
  } else {
    printer->Print(variables_,
                   "int rawValue = input.readEnum();\n"
                   "  @SuppressWarnings(\"deprecation\")\n"
                   "$type$ value = $type$.$for_number$(rawValue);\n"
                   "if (value == null) {\n"
                   "  unknownFields.mergeVarintField($number$, rawValue);\n"
                   "} else {\n"
                   "  $set_has_field_bit_message$\n"
                   "  $name$_ = rawValue;\n"
                   "}\n");
  }
}